

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFboCompletenessTests.cpp
# Opt level: O2

string * __thiscall
deqp::gls::fboc::details::attTypeName_abi_cxx11_
          (string *__return_storage_ptr__,details *this,GLenum bufType)

{
  allocator<char> *__a;
  int iVar1;
  char *__s;
  allocator<char> local_c;
  allocator<char> local_b;
  allocator<char> local_a;
  allocator<char> local_9;
  
  iVar1 = (int)this;
  if (iVar1 == 0x8d41) {
    __s = "rbo";
    __a = &local_a;
  }
  else if (iVar1 == 0x1702) {
    __s = "tex";
    __a = &local_b;
  }
  else if (iVar1 == 0) {
    __s = "none";
    __a = &local_9;
  }
  else {
    __s = "";
    __a = &local_c;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  return __return_storage_ptr__;
}

Assistant:

string attTypeName (GLenum bufType)
{
	switch (bufType)
	{
		case GL_NONE:
			return "none";
		case GL_RENDERBUFFER:
			return "rbo";
		case GL_TEXTURE:
			return "tex";
		default:
			DE_FATAL("Impossible case");
	}
	return ""; // Shut up compiler
}